

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall
MixSegmentTest_TestMultiUserDict_Test::TestBody(MixSegmentTest_TestMultiUserDict_Test *this)

{
  undefined1 uVar1;
  AssertionResult gtest_ar;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  MixSegment segment;
  string *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  string *this_00;
  string *this_01;
  string *in_stack_fffffffffffffd78;
  char *expected_expression;
  int line;
  string *in_stack_fffffffffffffd80;
  allocator<char> *file;
  string *in_stack_fffffffffffffd88;
  string *connector;
  Type type;
  allocator<char> *in_stack_fffffffffffffd90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *in_stack_fffffffffffffd98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Message *in_stack_fffffffffffffdb8;
  AssertHelper *in_stack_fffffffffffffdc0;
  allocator<char> local_229;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  string local_1f8 [39];
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  char local_190 [31];
  undefined1 local_171 [40];
  undefined1 local_149 [56];
  undefined1 local_111 [273];
  
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  begin._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)begin._M_current,in_stack_fffffffffffffd90);
  end._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)begin._M_current,(allocator<char> *)end._M_current);
  cppjieba::MixSegment::MixSegment
            ((MixSegment *)end._M_current,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  std::__cxx11::string::~string((string *)(local_171 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_171);
  std::__cxx11::string::~string((string *)(local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_149);
  std::__cxx11::string::~string((string *)(local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c8168);
  std::__cxx11::string::string(local_1b0);
  connector = (string *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)begin._M_current,(allocator<char> *)end._M_current);
  cppjieba::MixSegment::Cut
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c81bf);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  expected_expression = local_190;
  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd58);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd58);
  file = &local_229;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)begin._M_current,(allocator<char> *)end._M_current);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (begin,end,connector);
  type = (Type)((ulong)connector >> 0x20);
  this_01 = local_1b0;
  this_00 = local_1f8;
  std::__cxx11::string::operator=(this_01,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  testing::internal::EqHelper<false>::Compare<char[48],std::__cxx11::string>
            (expected_expression,(char *)this_01,(char (*) [48])this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  line = (int)((ulong)expected_expression >> 0x20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdc0);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)end._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x1c8463);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)end._M_current,type,(char *)file,line,(char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0x1c84af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c850b);
  std::__cxx11::string::~string(local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  cppjieba::MixSegment::~MixSegment((MixSegment *)CONCAT17(uVar1,in_stack_fffffffffffffd60));
  return;
}

Assistant:

TEST(MixSegmentTest, TestMultiUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", 
        "../test/testdata/userdict.utf8;../test/testdata/userdict.2.utf8");
  vector<string> words;
  string res;

  segment.Cut("忽如一夜春风来，千树万树梨花开", words);
  res = limonp::Join(words.begin(), words.end(), "/");
  ASSERT_EQ("忽如一夜春风来/，/千树万树梨花开", res);
}